

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O2

int arg_parse_enum_helper(arg *arg,char *err_msg)

{
  char *__s1;
  int iVar1;
  char *in_RAX;
  ulong uVar2;
  arg_enum_list *paVar3;
  int *piVar4;
  char *endptr;
  
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  endptr = in_RAX;
  uVar2 = strtol(arg->val,&endptr,10);
  __s1 = arg->val;
  if ((*__s1 == '\0') || (*endptr != '\0')) {
LAB_00125663:
    for (piVar4 = &arg->def->enums->val; ((arg_enum_list *)(piVar4 + -2))->name != (char *)0x0;
        piVar4 = piVar4 + 4) {
      iVar1 = strcmp(__s1,((arg_enum_list *)(piVar4 + -2))->name);
      if (iVar1 == 0) {
        uVar2 = (ulong)(uint)*piVar4;
        goto LAB_001256d8;
      }
    }
    if (err_msg == (char *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      snprintf(err_msg,200,"Option %s: Invalid value \'%s\'\n",arg->name,__s1);
    }
  }
  else {
    paVar3 = arg->def->enums;
    do {
      if (paVar3->name == (char *)0x0) goto LAB_00125663;
      piVar4 = &paVar3->val;
      paVar3 = paVar3 + 1;
    } while (uVar2 != (long)*piVar4);
  }
LAB_001256d8:
  return (int)uVar2;
}

Assistant:

int arg_parse_enum_helper(const struct arg *arg, char *err_msg) {
  const struct arg_enum_list *listptr;
  long rawval;  // NOLINT
  char *endptr;

  if (err_msg) err_msg[0] = '\0';

  /* First see if the value can be parsed as a raw value */
  rawval = strtol(arg->val, &endptr, 10);
  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    /* Got a raw value, make sure it's valid */
    for (listptr = arg->def->enums; listptr->name; listptr++)
      if (listptr->val == rawval) return (int)rawval;
  }

  /* Next see if it can be parsed as a string */
  for (listptr = arg->def->enums; listptr->name; listptr++)
    if (!strcmp(arg->val, listptr->name)) return listptr->val;

  SET_ERR_STRING("Option %s: Invalid value '%s'\n", arg->name, arg->val);
  return 0;
}